

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O3

int __thiscall lsvm::hashset::remove(hashset *this,char *__filename)

{
  uint uVar1;
  equals_fp p_Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  hash hVar6;
  uint uVar7;
  ulong uVar8;
  equals_fp p_Var9;
  uint uVar10;
  equals_fp p_Var11;
  
  hVar6 = (*this->hash)(__filename);
  p_Var2 = (&this[1].equals)[(uint)this->bits & (uint)hVar6];
  do {
    if (p_Var2 == (equals_fp)0x0) {
      return 0;
    }
    uVar1 = (&primes)[*(uint *)(p_Var2 + 0xc)];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = hVar6;
    uVar8 = SUB168(auVar3 % ZEXT416(uVar1),0);
    p_Var9 = p_Var2 + (uVar8 * 2 + 2) * 8;
    uVar5 = uVar1 - 1;
    uVar7 = (this->range * uVar1) / 100000;
    if (uVar1 <= uVar7) {
      uVar7 = uVar5;
    }
    uVar10 = uVar7 + SUB164(auVar3 % ZEXT416(uVar1),0);
    if (uVar10 < uVar1) {
      p_Var11 = p_Var9 + (ulong)uVar7 * 0x10;
      do {
        if (((*(hash *)p_Var9 == hVar6) && (*(void **)(p_Var9 + 8) != (void *)0x0)) &&
           (bVar4 = (*this->equals)(__filename,*(void **)(p_Var9 + 8)), bVar4)) {
LAB_00105591:
          hVar6 = *(hash *)(p_Var9 + 8);
          *(hash *)p_Var9 = 0;
          *(hash *)(p_Var9 + 8) = 0;
          *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + -1;
          this->count = this->count - 1;
          return (int)hVar6;
        }
        p_Var9 = p_Var9 + 0x10;
      } while (p_Var9 <= p_Var11);
    }
    else {
      if (uVar8 <= uVar5) {
        do {
          if (((*(hash *)p_Var9 == hVar6) && (*(void **)(p_Var9 + 8) != (void *)0x0)) &&
             (bVar4 = (*this->equals)(__filename,*(void **)(p_Var9 + 8)), bVar4)) goto LAB_00105591;
          p_Var9 = p_Var9 + 0x10;
        } while (p_Var9 <= p_Var2 + 0x10 + (ulong)uVar5 * 0x10);
      }
      p_Var9 = p_Var2 + 0x10;
      do {
        if (((*(hash *)p_Var9 == hVar6) && (*(void **)(p_Var9 + 8) != (void *)0x0)) &&
           (bVar4 = (*this->equals)(__filename,*(void **)(p_Var9 + 8)), bVar4)) goto LAB_00105591;
        p_Var9 = p_Var9 + 0x10;
      } while (p_Var9 <= p_Var2 + ((ulong)(uVar10 - uVar1) * 2 + 2) * 8);
    }
    p_Var2 = *(equals_fp *)p_Var2;
  } while( true );
}

Assistant:

void* remove(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *(partition(h,bit));

    // find key in a bucket using open address
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    return null;
}